

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O2

void save_resets(FILE *fp,AREA_DATA_conflict *pArea)

{
  short sVar1;
  ROOM_INDEX_DATA *pRVar2;
  ulong uVar3;
  ulong uVar4;
  int vnum;
  char *pcVar5;
  RESET_DATA *pRVar6;
  
  fwrite("#RESETS\n",8,1,(FILE *)fp);
  vnum = (int)pArea->min_vnum;
  while( true ) {
    if (pArea->max_vnum < vnum) {
      fwrite("S\n\n",3,1,(FILE *)fp);
      return;
    }
    pRVar2 = get_room_index(vnum);
    if (pRVar2 != (ROOM_INDEX_DATA *)0x0) break;
LAB_003a7b2e:
    vnum = vnum + 1;
  }
  pRVar6 = (RESET_DATA *)&pRVar2->reset_first;
switchD_003a79d5_caseD_48:
  pRVar6 = pRVar6->next;
  if (pRVar6 == (RESET_DATA *)0x0) goto LAB_003a7b2e;
  switch(pRVar6->command) {
  case 'D':
    pcVar5 = "LOCKED";
    if (pRVar6->arg3 == 1) {
      pcVar5 = "CLOSED";
    }
    if (pRVar6->arg3 == 0) {
      pcVar5 = "OPEN";
    }
    fprintf((FILE *)fp,"DOOR %d %s %s\n",(ulong)(uint)(int)pRVar6->arg1,
            direction_table[pRVar6->arg2].name,pcVar5);
    goto switchD_003a79d5_caseD_48;
  case 'E':
    sVar1 = pRVar6->arg1;
    pcVar5 = flag_name_lookup((long)pRVar6->arg3,wear_locations);
    pcVar5 = upstring(pcVar5);
    fprintf((FILE *)fp,"EQUIP %d %s\n",(ulong)(uint)(int)sVar1,pcVar5);
    goto switchD_003a79d5_caseD_48;
  case 'F':
    uVar4 = (ulong)(uint)(int)pRVar6->arg1;
    uVar3 = (ulong)(uint)(int)pRVar6->arg2;
    pcVar5 = "FOLLOW %d %d\n";
    break;
  case 'G':
    fprintf((FILE *)fp,"GIVE %d\n",(ulong)(uint)(int)pRVar6->arg1);
  default:
    goto switchD_003a79d5_caseD_48;
  case 'M':
    fprintf((FILE *)fp,"MOB %d TO %d GLIMIT %d LLIMIT %d\n",(ulong)(uint)(int)pRVar6->arg1,
            (ulong)(uint)(int)pRVar6->arg3,(ulong)(uint)(int)pRVar6->arg2,
            (ulong)(uint)(int)pRVar6->arg4);
    goto switchD_003a79d5_caseD_48;
  case 'O':
    uVar4 = (ulong)(uint)(int)pRVar6->arg1;
    uVar3 = (ulong)(uint)(int)pRVar6->arg3;
    pcVar5 = "OBJECT %d TO %d\n";
    break;
  case 'P':
    fprintf((FILE *)fp,"PUT %d IN %d COUNT %d\n",(ulong)(uint)(int)pRVar6->arg1,
            (ulong)(uint)(int)pRVar6->arg3,(ulong)(uint)(int)pRVar6->arg4);
    goto switchD_003a79d5_caseD_48;
  case 'R':
    uVar4 = (ulong)(uint)(int)pRVar6->arg1;
    uVar3 = (ulong)(uint)(int)pRVar6->arg2;
    pcVar5 = "RANDOMIZE %d %d\n";
  }
  fprintf((FILE *)fp,pcVar5,uVar4,uVar3);
  goto switchD_003a79d5_caseD_48;
}

Assistant:

void save_resets(FILE *fp, AREA_DATA *pArea)
{
	RESET_DATA *pReset;
	ROOM_INDEX_DATA *pRoomIndex;
	int i;

	fprintf(fp, "#RESETS\n");

	for (i = pArea->min_vnum; i < (pArea->max_vnum + 1); i++)
	{
		if ((pRoomIndex = get_room_index(i)) == nullptr)
			continue;

		for (pReset = pRoomIndex->reset_first; pReset != nullptr; pReset = pReset->next)
		{
			switch (pReset->command)
			{
				case 'M':
					fprintf(fp, "MOB %d TO %d GLIMIT %d LLIMIT %d\n", pReset->arg1, pReset->arg3, pReset->arg2, pReset->arg4);
					break;
				case 'O':
					fprintf(fp, "OBJECT %d TO %d\n", pReset->arg1, pReset->arg3);
					break;
				case 'P':
					fprintf(fp, "PUT %d IN %d COUNT %d\n", pReset->arg1, pReset->arg3, pReset->arg4);
					break;
				case 'G':
					fprintf(fp, "GIVE %d\n", pReset->arg1);
					break;
				case 'F':
					fprintf(fp, "FOLLOW %d %d\n", pReset->arg1, pReset->arg2);
					break;
				case 'E':
					fprintf(fp, "EQUIP %d %s\n", pReset->arg1, (upstring(flag_name_lookup(pReset->arg3, wear_locations))));
					break;
				case 'D':
					fprintf(fp, "DOOR %d %s %s\n",
						pReset->arg1,
						direction_table[pReset->arg2].name,
						pReset->arg3 == 0 ? "OPEN" : 
							pReset->arg3 == 1 ? "CLOSED" : "LOCKED");
					break;
				case 'R':
					fprintf(fp, "RANDOMIZE %d %d\n", pReset->arg1, pReset->arg2);
					break;
				default:
					break;
			}
		}
	}

	fprintf(fp, "S\n\n");
}